

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::_::ExclusiveJoinPromiseNode::tracePromise
          (ExclusiveJoinPromiseNode *this,TraceBuilder *builder,bool stopAtNextEvent)

{
  PromiseNode *pPVar1;
  bool stopAtNextEvent_local;
  TraceBuilder *builder_local;
  ExclusiveJoinPromiseNode *this_local;
  
  if (!stopAtNextEvent) {
    pPVar1 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::get(&(this->left).dependency);
    if (pPVar1 == (PromiseNode *)0x0) {
      pPVar1 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::get(&(this->right).dependency);
      if (pPVar1 != (PromiseNode *)0x0) {
        pPVar1 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator->
                           (&(this->right).dependency);
        (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[4])(pPVar1,builder,0);
      }
    }
    else {
      pPVar1 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator->(&(this->left).dependency)
      ;
      (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[4])(pPVar1,builder,0);
    }
  }
  return;
}

Assistant:

void ExclusiveJoinPromiseNode::tracePromise(TraceBuilder& builder, bool stopAtNextEvent) {
  // TODO(debug): Maybe use __builtin_return_address to get the locations that called
  //   exclusiveJoin()?

  if (stopAtNextEvent) return;

  // Trace the left branch I guess.
  if (left.dependency.get() != nullptr) {
    left.dependency->tracePromise(builder, false);
  } else if (right.dependency.get() != nullptr) {
    right.dependency->tracePromise(builder, false);
  }
}